

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-lexer.cc
# Opt level: O1

Token * __thiscall wabt::WastLexer::GetToken(Token *__return_storage_ptr__,WastLexer *this)

{
  byte *pbVar1;
  char *pcVar2;
  TokenType TVar3;
  long lVar4;
  size_t sVar5;
  byte *pbVar6;
  byte *pbVar7;
  byte *pbVar8;
  uint uVar9;
  anon_class_8_1_8991fb9c column;
  bool bVar10;
  string_view name;
  Token local_70;
  
LAB_0017bf65:
  do {
    pbVar1 = (byte *)this->buffer_end_;
    pbVar6 = (byte *)this->cursor_;
    this->token_start_ = (char *)pbVar6;
    uVar9 = 0xffffffff;
    if (pbVar6 < pbVar1) {
      uVar9 = (uint)*pbVar6;
    }
    if (0x60 < (int)uVar9) {
      if ((int)uVar9 < 0x6e) {
        if (uVar9 == 0x61) {
          pcVar2 = "align=";
          sVar5 = 6;
          TVar3 = AlignEqNat;
LAB_0017c2eb:
          name._M_str = pcVar2;
          name._M_len = sVar5;
          GetNameEqNumToken(__return_storage_ptr__,this,name,TVar3);
          return __return_storage_ptr__;
        }
        if (uVar9 == 0x69) goto LAB_0017c3ce;
      }
      else {
        if (uVar9 == 0x6e) goto LAB_0017c3e0;
        if (uVar9 == 0x6f) {
          pcVar2 = "offset=";
          sVar5 = 7;
          TVar3 = OffsetEqNat;
          goto LAB_0017c2eb;
        }
      }
      goto switchD_0017bf9a_caseD_b;
    }
    switch(uVar9) {
    case 9:
    case 10:
    case 0xd:
    case 0x20:
      ReadWhitespace(this);
      break;
    case 0x22:
      GetStringToken(__return_storage_ptr__,this);
      return __return_storage_ptr__;
    case 0x24:
      GetIdToken(__return_storage_ptr__,this);
      return __return_storage_ptr__;
    case 0x28:
      bVar10 = false;
      lVar4 = 0;
      pbVar7 = pbVar6;
      do {
        uVar9 = 0xffffffff;
        pbVar8 = pbVar7;
        if (pbVar7 < pbVar1) {
          pbVar8 = pbVar7 + 1;
          this->cursor_ = (char *)pbVar8;
          uVar9 = (uint)*pbVar7;
        }
        if (uVar9 != (int)"(;"[lVar4]) {
          this->cursor_ = (char *)pbVar6;
          break;
        }
        lVar4 = lVar4 + 1;
        bVar10 = lVar4 == 2;
        pbVar7 = pbVar8;
      } while (!bVar10);
      if (bVar10) goto code_r0x0017c089;
      pbVar6 = (byte *)this->cursor_;
      bVar10 = false;
      lVar4 = 0;
      pbVar7 = pbVar6;
      goto LAB_0017c31c;
    case 0x29:
      if (pbVar6 < pbVar1) {
        this->cursor_ = (char *)(pbVar6 + 1);
      }
      TVar3 = Rpar;
      goto LAB_0017c1d5;
    case 0x2b:
    case 0x2d:
      if (pbVar6 < pbVar1) {
        this->cursor_ = (char *)(pbVar6 + 1);
      }
      pbVar6 = (byte *)this->cursor_;
      uVar9 = 0xffffffff;
      if (pbVar6 < pbVar1) {
        uVar9 = (uint)*pbVar6;
      }
      if (uVar9 - 0x31 < 9) goto LAB_0017c208;
      if (uVar9 == 0x6e) {
LAB_0017c3e0:
        GetNanToken(__return_storage_ptr__,this);
        return __return_storage_ptr__;
      }
      if (uVar9 == 0x69) {
LAB_0017c3ce:
        GetInfToken(__return_storage_ptr__,this);
        return __return_storage_ptr__;
      }
      if (uVar9 != 0x30) {
        GetReservedToken(__return_storage_ptr__,this);
        return __return_storage_ptr__;
      }
      bVar10 = false;
      lVar4 = 0;
      pbVar7 = pbVar6;
      goto LAB_0017c395;
    case 0x30:
      bVar10 = false;
      lVar4 = 0;
      pbVar7 = pbVar6;
      goto LAB_0017c240;
    case 0x31:
    case 0x32:
    case 0x33:
    case 0x34:
    case 0x35:
    case 0x36:
    case 0x37:
    case 0x38:
    case 0x39:
      goto switchD_0017bf9a_caseD_31;
    case 0x3b:
      bVar10 = false;
      lVar4 = 0;
      pbVar7 = pbVar6;
      do {
        uVar9 = 0xffffffff;
        pbVar8 = pbVar7;
        if (pbVar7 < pbVar1) {
          pbVar8 = pbVar7 + 1;
          this->cursor_ = (char *)pbVar8;
          uVar9 = (uint)*pbVar7;
        }
        if (uVar9 != (int)";;"[lVar4]) {
          this->cursor_ = (char *)pbVar6;
          break;
        }
        lVar4 = lVar4 + 1;
        bVar10 = lVar4 == 2;
        pbVar7 = pbVar8;
      } while (!bVar10);
      pbVar6 = (byte *)this->cursor_;
      if (!bVar10) {
        if (pbVar6 < pbVar1) {
          this->cursor_ = (char *)(pbVar6 + 1);
        }
        goto LAB_0017c1a6;
      }
      do {
        uVar9 = 0xffffffff;
        pbVar7 = pbVar6;
        if (pbVar6 < pbVar1) {
          pbVar7 = pbVar6 + 1;
          this->cursor_ = (char *)pbVar7;
          uVar9 = (uint)*pbVar6;
        }
        if (uVar9 == 0xffffffff) goto LAB_0017c1c5;
        pbVar6 = pbVar7;
      } while (uVar9 != 10);
      this->line_ = this->line_ + 1;
      this->line_start_ = this->cursor_;
      break;
    default:
      if (uVar9 == 0xffffffff) goto LAB_0017c1c5;
    case 0xb:
    case 0xc:
    case 0xe:
    case 0xf:
    case 0x10:
    case 0x11:
    case 0x12:
    case 0x13:
    case 0x14:
    case 0x15:
    case 0x16:
    case 0x17:
    case 0x18:
    case 0x19:
    case 0x1a:
    case 0x1b:
    case 0x1c:
    case 0x1d:
    case 0x1e:
    case 0x1f:
    case 0x21:
    case 0x23:
    case 0x25:
    case 0x26:
    case 0x27:
    case 0x2a:
    case 0x2c:
    case 0x2e:
    case 0x2f:
    case 0x3a:
switchD_0017bf9a_caseD_b:
      if (pbVar6 < pbVar1) {
        lVar4 = (ulong)*pbVar6 + 1;
      }
      else {
        lVar4 = 0;
      }
      if ((""[lVar4] & 2U) != 0) {
        GetKeywordToken(__return_storage_ptr__,this);
        return __return_storage_ptr__;
      }
      if (pbVar6 < pbVar1) {
        lVar4 = (ulong)*pbVar6 + 1;
      }
      else {
        lVar4 = 0;
      }
      if ((""[lVar4] & 1U) != 0) {
        ReadReservedChars(this);
        TVar3 = Reserved;
        sVar5 = 0;
        goto LAB_0017c467;
      }
      if (pbVar6 < pbVar1) {
        this->cursor_ = (char *)(pbVar6 + 1);
      }
LAB_0017c1a6:
      Error(this,0x1df67b);
    }
  } while( true );
  while( true ) {
    lVar4 = lVar4 + 1;
    bVar10 = lVar4 == 2;
    pbVar7 = pbVar8;
    if (bVar10) break;
LAB_0017c240:
    uVar9 = 0xffffffff;
    pbVar8 = pbVar7;
    if (pbVar7 < pbVar1) {
      pbVar8 = pbVar7 + 1;
      this->cursor_ = (char *)pbVar8;
      uVar9 = (uint)*pbVar7;
    }
    if (uVar9 != (int)":0x"[lVar4 + 1]) {
      this->cursor_ = (char *)pbVar6;
      break;
    }
  }
  if (bVar10) {
    TVar3 = Last_Literal;
    goto LAB_0017c40b;
  }
switchD_0017bf9a_caseD_31:
  TVar3 = Last_Literal;
  goto LAB_0017c422;
code_r0x0017c089:
  bVar10 = ReadBlockComment(this);
  if (!bVar10) goto LAB_0017c1c5;
  goto LAB_0017bf65;
LAB_0017c1c5:
  TVar3 = Eof;
  goto LAB_0017c1d5;
  while( true ) {
    lVar4 = lVar4 + 1;
    bVar10 = lVar4 == 2;
    pbVar7 = pbVar8;
    if (bVar10) break;
LAB_0017c395:
    uVar9 = 0xffffffff;
    pbVar8 = pbVar7;
    if (pbVar7 < pbVar1) {
      pbVar8 = pbVar7 + 1;
      this->cursor_ = (char *)pbVar8;
      uVar9 = (uint)*pbVar7;
    }
    if (uVar9 != (int)":0x"[lVar4 + 1]) {
      this->cursor_ = (char *)pbVar6;
      break;
    }
  }
  if (bVar10) {
    TVar3 = Int;
LAB_0017c40b:
    GetHexNumberToken(__return_storage_ptr__,this,TVar3);
    return __return_storage_ptr__;
  }
LAB_0017c208:
  TVar3 = Int;
LAB_0017c422:
  GetNumberToken(__return_storage_ptr__,this,TVar3);
  return __return_storage_ptr__;
  while( true ) {
    lVar4 = lVar4 + 1;
    bVar10 = lVar4 == 2;
    pbVar7 = pbVar8;
    if (bVar10) break;
LAB_0017c31c:
    uVar9 = 0xffffffff;
    pbVar8 = pbVar7;
    if (pbVar7 < pbVar1) {
      pbVar8 = pbVar7 + 1;
      this->cursor_ = (char *)pbVar8;
      uVar9 = (uint)*pbVar7;
    }
    if (uVar9 != (int)"(@"[lVar4]) {
      this->cursor_ = (char *)pbVar6;
      break;
    }
  }
  if (bVar10) {
    GetIdToken(&local_70,this);
    sVar5 = 2;
    TVar3 = LparAnn;
LAB_0017c467:
    TextToken(__return_storage_ptr__,this,TVar3,sVar5);
    return __return_storage_ptr__;
  }
  if (this->cursor_ < pbVar1) {
    this->cursor_ = this->cursor_ + 1;
  }
  TVar3 = Lpar;
LAB_0017c1d5:
  BareToken(__return_storage_ptr__,this,TVar3);
  return __return_storage_ptr__;
}

Assistant:

Token WastLexer::GetToken() {
  while (true) {
    token_start_ = cursor_;
    switch (PeekChar()) {
      case kEof:
        return BareToken(TokenType::Eof);

      case '(':
        if (MatchString("(;")) {
          if (ReadBlockComment()) {
            continue;
          }
          return BareToken(TokenType::Eof);
        } else if (MatchString("(@")) {
          GetIdToken();
          // offset=2 to skip the "(@" prefix
          return TextToken(TokenType::LparAnn, 2);
        } else {
          ReadChar();
          return BareToken(TokenType::Lpar);
        }
        break;

      case ')':
        ReadChar();
        return BareToken(TokenType::Rpar);

      case ';':
        if (MatchString(";;")) {
          if (ReadLineComment()) {
            continue;
          }
          return BareToken(TokenType::Eof);
        } else {
          ReadChar();
          ERROR("unexpected char");
          continue;
        }
        break;

      case ' ':
      case '\t':
      case '\r':
      case '\n':
        ReadWhitespace();
        continue;

      case '"':
        return GetStringToken();

      case '+':
      case '-':
        ReadChar();
        switch (PeekChar()) {
          case 'i':
            return GetInfToken();

          case 'n':
            return GetNanToken();

          case '0':
            return MatchString("0x") ? GetHexNumberToken(TokenType::Int)
                                     : GetNumberToken(TokenType::Int);
          case '1':
          case '2':
          case '3':
          case '4':
          case '5':
          case '6':
          case '7':
          case '8':
          case '9':
            return GetNumberToken(TokenType::Int);

          default:
            return GetReservedToken();
        }
        break;

      case '0':
        return MatchString("0x") ? GetHexNumberToken(TokenType::Nat)
                                 : GetNumberToken(TokenType::Nat);

      case '1':
      case '2':
      case '3':
      case '4':
      case '5':
      case '6':
      case '7':
      case '8':
      case '9':
        return GetNumberToken(TokenType::Nat);

      case '$':
        return GetIdToken();

      case 'a':
        return GetNameEqNumToken("align=", TokenType::AlignEqNat);

      case 'i':
        return GetInfToken();

      case 'n':
        return GetNanToken();

      case 'o':
        return GetNameEqNumToken("offset=", TokenType::OffsetEqNat);

      default:
        if (IsKeyword(PeekChar())) {
          return GetKeywordToken();
        } else if (IsIdChar(PeekChar())) {
          return GetReservedToken();
        } else {
          ReadChar();
          ERROR("unexpected char");
          continue;
        }
    }
  }
}